

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_include_pattern(archive *_a,char *pattern)

{
  int iVar1;
  wchar_t magic_test;
  wchar_t r;
  archive_match *a;
  char *pattern_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_include_pattern");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else if ((pattern == (char *)0x0) || (*pattern == '\0')) {
    archive_set_error(_a,0x16,"pattern is empty");
    _a_local._4_4_ = L'\xffffffe7';
  }
  else {
    _a_local._4_4_ = add_pattern_mbs((archive_match *)_a,(match_list *)&_a[1].file_count,pattern);
    if (_a_local._4_4_ == L'\0') {
      _a_local._4_4_ = L'\0';
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_include_pattern(struct archive *_a, const char *pattern)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_include_pattern");
	a = (struct archive_match *)_a;

	if (pattern == NULL || *pattern == '\0') {
		archive_set_error(&(a->archive), EINVAL, "pattern is empty");
		return (ARCHIVE_FAILED);
	}
	if ((r = add_pattern_mbs(a, &(a->inclusions), pattern)) != ARCHIVE_OK)
		return (r);
	return (ARCHIVE_OK);
}